

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

bool __thiscall google::protobuf::io::CodedInputStream::Skip(CodedInputStream *this,int count)

{
  int original_buffer_size_00;
  int original_buffer_size;
  int count_local;
  CodedInputStream *this_local;
  
  if (count < 0) {
    this_local._7_1_ = false;
  }
  else {
    original_buffer_size_00 = BufferSize(this);
    if (original_buffer_size_00 < count) {
      this_local._7_1_ = SkipFallback(this,count,original_buffer_size_00);
    }
    else {
      Advance(this,count);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool CodedInputStream::Skip(int count) {
  if (count < 0) return false;  // security: count is often user-supplied

  const int original_buffer_size = BufferSize();

  if (count <= original_buffer_size) {
    // Just skipping within the current buffer.  Easy.
    Advance(count);
    return true;
  }

  return SkipFallback(count, original_buffer_size);
}